

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

int ov_halfrate(OggVorbis_File *vf,int flag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int local_44;
  
  bVar1 = false;
  iVar3 = -0x83;
  do {
    if (vf->vi == (vorbis_info *)0x0) {
LAB_001a8e74:
      if (bVar1) {
        iVar3 = local_44;
      }
      return iVar3;
    }
    if (3 < vf->ready_state) {
      vorbis_dsp_clear(&vf->vd);
      vorbis_block_clear(&vf->vb);
      vf->ready_state = 3;
      lVar4 = vf->pcm_offset;
      if (-1 < lVar4) {
        vf->pcm_offset = -1;
        ov_pcm_seek(vf,lVar4);
      }
    }
    if (vf->links < 1) {
LAB_001a8e72:
      iVar3 = 0;
      goto LAB_001a8e74;
    }
    lVar4 = 0;
    lVar5 = 0;
    while (iVar2 = vorbis_synthesis_halfrate((vorbis_info *)((long)&vf->vi->version + lVar4),flag),
          iVar2 == 0) {
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
      if (vf->links <= lVar5) goto LAB_001a8e72;
    }
    if (flag == 0) goto LAB_001a8e74;
    if (!bVar1) {
      local_44 = -0x83;
    }
    bVar1 = true;
    flag = 0;
  } while( true );
}

Assistant:

int ov_halfrate(OggVorbis_File *vf,int flag){
  int i;
  if(vf->vi==NULL)return OV_EINVAL;
  if(vf->ready_state>STREAMSET){
    /* clear out stream state; dumping the decode machine is needed to
       reinit the MDCT lookups. */
    vorbis_dsp_clear(&vf->vd);
    vorbis_block_clear(&vf->vb);
    vf->ready_state=STREAMSET;
    if(vf->pcm_offset>=0){
      ogg_int64_t pos=vf->pcm_offset;
      vf->pcm_offset=-1; /* make sure the pos is dumped if unseekable */
      ov_pcm_seek(vf,pos);
    }
  }

  for(i=0;i<vf->links;i++){
    if(vorbis_synthesis_halfrate(vf->vi+i,flag)){
      if(flag) ov_halfrate(vf,0);
      return OV_EINVAL;
    }
  }
  return 0;
}